

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O2

int coda_bin_cursor_read_int64_array
              (coda_cursor *cursor,int64_t *dst,coda_array_ordering array_ordering)

{
  int iVar1;
  int iVar2;
  coda_type *pcVar3;
  
  pcVar3 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar3->format) {
    pcVar3 = *(coda_type **)&pcVar3->type_class;
  }
  if ((*(coda_type **)(pcVar3 + 1))->format == coda_format_ascii) {
    iVar2 = read_array(cursor,coda_ascii_cursor_read_int64,(uint8_t *)dst,8,coda_array_ordering_c);
    iVar1 = -1;
    if (iVar2 == 0) {
      if ((array_ordering != coda_array_ordering_c) &&
         (iVar1 = transpose_array(cursor,dst,8), iVar1 != 0)) {
        return -1;
      }
      iVar1 = 0;
    }
    return iVar1;
  }
  if ((*(coda_type **)(pcVar3 + 1))->format != coda_format_binary) {
    __assert_fail("type->base_type->format == coda_format_ascii",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-bin-cursor.c"
                  ,0x426,
                  "int coda_bin_cursor_read_int64_array(const coda_cursor *, int64_t *, coda_array_ordering)"
                 );
  }
  iVar1 = read_array(cursor,coda_bin_cursor_read_int64,(uint8_t *)dst,8,array_ordering);
  return iVar1;
}

Assistant:

int coda_bin_cursor_read_int64_array(const coda_cursor *cursor, int64_t *dst, coda_array_ordering array_ordering)
{
    coda_type_array *type = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    if (type->base_type->format == coda_format_binary)
    {
        return read_array(cursor, (read_function)&coda_bin_cursor_read_int64, (uint8_t *)dst, sizeof(int64_t),
                          array_ordering);
    }
    assert(type->base_type->format == coda_format_ascii);
    if (read_array(cursor, (read_function)&coda_ascii_cursor_read_int64, (uint8_t *)dst, sizeof(int64_t),
                   coda_array_ordering_c) != 0)
    {
        return -1;
    }
    if (array_ordering != coda_array_ordering_c)
    {
        if (transpose_array(cursor, dst, sizeof(int64_t)) != 0)
        {
            return -1;
        }
    }

    return 0;
}